

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfect_aggregate_hashtable.cpp
# Opt level: O1

void __thiscall
duckdb::PerfectAggregateHashTable::Combine
          (PerfectAggregateHashTable *this,PerfectAggregateHashTable *other)

{
  Allocator *allocator;
  type pTVar1;
  ArenaAllocator *this_00;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  idx_t count;
  ulong uVar4;
  RowOperationsState row_state;
  Vector target_addresses;
  Vector source_addresses;
  undefined1 local_158 [8];
  _Head_base<0UL,_duckdb::Vector_*,_false> local_150;
  shared_ptr<duckdb::TupleDataLayout,_true> *local_148;
  data_ptr_t local_140;
  data_ptr_t local_138;
  LogicalType local_130;
  LogicalType local_118;
  Vector local_100;
  Vector local_98;
  
  LogicalType::LogicalType(&local_118,POINTER);
  Vector::Vector(&local_98,&local_118,0x800);
  LogicalType::~LogicalType(&local_118);
  LogicalType::LogicalType(&local_130,POINTER);
  Vector::Vector(&local_100,&local_130,0x800);
  LogicalType::~LogicalType(&local_130);
  local_138 = local_98.data;
  local_140 = local_100.data;
  pdVar3 = other->data;
  pdVar2 = this->data;
  local_158 = (undefined1  [8])
              unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>
              ::operator*(&this->aggregate_allocator);
  local_150._M_head_impl = (Vector *)0x0;
  if (this->total_groups == 0) {
    count = 0;
  }
  else {
    local_148 = &(this->super_BaseAggregateHashTable).layout_ptr;
    uVar4 = 0;
    count = 0;
    do {
      if ((other->group_is_set).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
          super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
          super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
          super__Head_base<0UL,_bool_*,_false>._M_head_impl[uVar4] == true) {
        (this->group_is_set).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
        super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
        super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
        super__Head_base<0UL,_bool_*,_false>._M_head_impl[uVar4] = true;
        *(data_ptr_t *)(local_138 + count * 8) = pdVar3;
        *(data_ptr_t *)(local_140 + count * 8) = pdVar2;
        count = count + 1;
        if (count == 0x800) {
          pTVar1 = shared_ptr<duckdb::TupleDataLayout,_true>::operator*(local_148);
          RowOperations::CombineStates
                    ((RowOperationsState *)local_158,pTVar1,&local_98,&local_100,0x800);
          count = 0;
        }
      }
      pdVar3 = pdVar3 + this->tuple_size;
      pdVar2 = pdVar2 + this->tuple_size;
      uVar4 = uVar4 + 1;
    } while (uVar4 < this->total_groups);
  }
  pTVar1 = shared_ptr<duckdb::TupleDataLayout,_true>::operator*
                     (&(this->super_BaseAggregateHashTable).layout_ptr);
  RowOperations::CombineStates((RowOperationsState *)local_158,pTVar1,&local_98,&local_100,count);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ArenaAllocator,std::default_delete<duckdb::ArenaAllocator>,true>,std::allocator<duckdb::unique_ptr<duckdb::ArenaAllocator,std::default_delete<duckdb::ArenaAllocator>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ArenaAllocator,std::default_delete<duckdb::ArenaAllocator>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ArenaAllocator,std::default_delete<duckdb::ArenaAllocator>,true>,std::allocator<duckdb::unique_ptr<duckdb::ArenaAllocator,std::default_delete<duckdb::ArenaAllocator>,true>>>
              *)&this->stored_allocators,&other->aggregate_allocator);
  allocator = (this->super_BaseAggregateHashTable).allocator;
  this_00 = (ArenaAllocator *)operator_new(0x48);
  ArenaAllocator::ArenaAllocator(this_00,allocator,0x800);
  ::std::__uniq_ptr_impl<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>_>::
  reset((__uniq_ptr_impl<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>_> *)
        &other->aggregate_allocator,this_00);
  if ((tuple<duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>)local_150._M_head_impl !=
      (_Head_base<0UL,_duckdb::Vector_*,_false>)0x0) {
    ::std::default_delete<duckdb::Vector>::operator()
              ((default_delete<duckdb::Vector> *)&local_150,local_150._M_head_impl);
  }
  if (local_100.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_100.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_100.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_100.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_100.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_100.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&local_100.type);
  if (local_98.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&local_98.type);
  return;
}

Assistant:

void PerfectAggregateHashTable::Combine(PerfectAggregateHashTable &other) {
	D_ASSERT(total_groups == other.total_groups);
	D_ASSERT(tuple_size == other.tuple_size);

	Vector source_addresses(LogicalType::POINTER);
	Vector target_addresses(LogicalType::POINTER);
	auto source_addresses_ptr = FlatVector::GetData<data_ptr_t>(source_addresses);
	auto target_addresses_ptr = FlatVector::GetData<data_ptr_t>(target_addresses);

	// iterate over all entries of both hash tables and call combine for all entries that can be combined
	data_ptr_t source_ptr = other.data;
	data_ptr_t target_ptr = data;
	idx_t combine_count = 0;
	RowOperationsState row_state(*aggregate_allocator);
	for (idx_t i = 0; i < total_groups; i++) {
		auto has_entry_source = other.group_is_set[i];
		// we only have any work to do if the source has an entry for this group
		if (has_entry_source) {
			group_is_set[i] = true;
			source_addresses_ptr[combine_count] = source_ptr;
			target_addresses_ptr[combine_count] = target_ptr;
			combine_count++;
			if (combine_count == STANDARD_VECTOR_SIZE) {
				RowOperations::CombineStates(row_state, *layout_ptr, source_addresses, target_addresses, combine_count);
				combine_count = 0;
			}
		}
		source_ptr += tuple_size;
		target_ptr += tuple_size;
	}
	RowOperations::CombineStates(row_state, *layout_ptr, source_addresses, target_addresses, combine_count);

	// FIXME: after moving the arena allocator, we currently have to ensure that the pointer is not nullptr, because the
	// FIXME: Destroy()-function of the hash table expects an allocator in some cases (e.g., for sorted aggregates)
	stored_allocators.push_back(std::move(other.aggregate_allocator));
	other.aggregate_allocator = make_uniq<ArenaAllocator>(allocator);
}